

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O1

void nn_chunkref_trim(nn_chunkref *self,size_t n)

{
  byte bVar1;
  void *pvVar2;
  ulong uVar3;
  
  bVar1 = (self->u).ref[0];
  uVar3 = (ulong)bVar1;
  if (uVar3 == 0xff) {
    pvVar2 = nn_chunk_trim(*(void **)((long)&self->u + 8),n);
    *(void **)((long)&self->u + 8) = pvVar2;
  }
  else {
    if (uVar3 < n) {
      nn_chunkref_trim_cold_1();
    }
    memmove((void *)((long)&self->u + 1),(void *)((long)&self->u + n + 1),uVar3 - n);
    (self->u).ref[0] = bVar1 - (char)n;
  }
  return;
}

Assistant:

void nn_chunkref_trim (struct nn_chunkref *self, size_t n)
{
    struct nn_chunkref_chunk *ch;

    if (self->u.ref [0] == 0xff) {
        ch = (struct nn_chunkref_chunk*) self;
        ch->chunk = nn_chunk_trim (ch->chunk, n);
        return;
    }

    nn_assert (self->u.ref [0] >= n);
    memmove (&self->u.ref [1], &self->u.ref [1 + n], self->u.ref [0] - n);
    self->u.ref [0] -= (uint8_t) n;
}